

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.h
# Opt level: O0

string * __thiscall
cmMakefile::GetModulesFile
          (string *__return_storage_ptr__,cmMakefile *this,string *name,bool *system)

{
  undefined1 local_48 [8];
  string debugBuffer;
  bool *system_local;
  string *name_local;
  cmMakefile *this_local;
  
  debugBuffer.field_2._8_8_ = system;
  std::__cxx11::string::string((string *)local_48);
  GetModulesFile(__return_storage_ptr__,this,name,(bool *)debugBuffer.field_2._8_8_,false,
                 (string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string GetModulesFile(const std::string& name, bool& system) const
  {
    std::string debugBuffer;
    return this->GetModulesFile(name, system, false, debugBuffer);
  }